

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_blas2.c
# Opt level: O0

int sp_cgemv(char *trans,singlecomplex alpha,SuperMatrix *A,singlecomplex *x,int incx,
            singlecomplex beta,singlecomplex *y,int incy)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  singlecomplex sVar4;
  singlecomplex sVar5;
  int iVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  char local_408 [8];
  char msg_2 [256];
  float ci_7;
  float cr_7;
  float ci_6;
  float cr_6;
  singlecomplex temp2;
  char msg_1 [256];
  float ci_5;
  float cr_5;
  float ci_4;
  float cr_4;
  char msg [256];
  float ci_3;
  float cr_3;
  float ci_2;
  float cr_2;
  float ci_1;
  float cr_1;
  float ci;
  float cr;
  singlecomplex comp_one;
  singlecomplex comp_zero;
  int notran;
  int ky;
  int kx;
  int jy;
  int jx;
  int iy;
  int irow;
  int j;
  int i;
  int leny;
  int lenx;
  singlecomplex temp1;
  singlecomplex temp;
  int info;
  singlecomplex *Aval;
  NCformat *Astore;
  int incy_local;
  singlecomplex *y_local;
  int incx_local;
  singlecomplex *x_local;
  SuperMatrix *A_local;
  char *trans_local;
  float fStack_18;
  singlecomplex beta_local;
  singlecomplex alpha_local;
  
  memset(&comp_one,0,8);
  iVar6 = strncmp(trans,"N",1);
  bVar7 = true;
  if (iVar6 != 0) {
    iVar6 = strncmp(trans,"n",1);
    bVar7 = iVar6 == 0;
  }
  pvVar3 = A->Store;
  unique0x00012000 = *(long *)((long)pvVar3 + 8);
  temp.r = 0.0;
  if (((bVar7) || (iVar6 = strncmp(trans,"T",1), iVar6 == 0)) ||
     (iVar6 = strncmp(trans,"C",1), iVar6 == 0)) {
    if ((A->nrow < 0) || (A->ncol < 0)) {
      temp.r = 4.2039e-45;
    }
    else if (incx == 0) {
      temp.r = 7.00649e-45;
    }
    else if (incy == 0) {
      temp.r = 1.12104e-44;
    }
  }
  else {
    temp.r = 1.4013e-45;
  }
  if (temp.r == 0.0) {
    if ((A->nrow != 0) && (A->ncol != 0)) {
      beta_local.r = alpha.r;
      beta_local.i = alpha.i;
      trans_local._4_4_ = beta.r;
      fStack_18 = beta.i;
      if ((beta_local.r == comp_one.r) && (!NAN(beta_local.r) && !NAN(comp_one.r))) {
        if ((((beta_local.i == comp_one.i) && (!NAN(beta_local.i) && !NAN(comp_one.i))) &&
            (trans_local._4_4_ == 1.0)) &&
           (((!NAN(trans_local._4_4_) && (fStack_18 == 0.0)) && (!NAN(fStack_18))))) {
          return 0;
        }
      }
      if (bVar7) {
        i = A->ncol;
        j = A->nrow;
      }
      else {
        i = A->nrow;
        j = A->ncol;
      }
      if (incx < 1) {
        notran = -(i + -1) * incx;
      }
      else {
        notran = 0;
      }
      if (incy < 1) {
        comp_zero.i = (float)(-(j + -1) * incy);
      }
      else {
        comp_zero.i = 0.0;
      }
      if (((trans_local._4_4_ != 1.0) || (NAN(trans_local._4_4_))) ||
         ((fStack_18 != 0.0 || (NAN(fStack_18))))) {
        if (incy == 1) {
          if (((trans_local._4_4_ != comp_one.r) || (NAN(trans_local._4_4_) || NAN(comp_one.r))) ||
             ((fStack_18 != comp_one.i || (NAN(fStack_18) || NAN(comp_one.i))))) {
            for (irow = 0; irow < j; irow = irow + 1) {
              fVar8 = y[irow].r;
              fVar9 = y[irow].i;
              y[irow].r = trans_local._4_4_ * y[irow].r + -(fStack_18 * y[irow].i);
              y[irow].i = fStack_18 * fVar8 + trans_local._4_4_ * fVar9;
            }
          }
          else {
            for (irow = 0; irow < j; irow = irow + 1) {
              sVar4.i = comp_one.i;
              sVar4.r = comp_one.r;
              y[irow] = sVar4;
            }
          }
        }
        else {
          jy = (int)comp_zero.i;
          if ((((trans_local._4_4_ != comp_one.r) || (NAN(trans_local._4_4_) || NAN(comp_one.r))) ||
              (fStack_18 != comp_one.i)) || (NAN(fStack_18) || NAN(comp_one.i))) {
            for (irow = 0; irow < j; irow = irow + 1) {
              fVar8 = y[jy].r;
              fVar9 = y[jy].i;
              y[jy].r = trans_local._4_4_ * y[jy].r + -(fStack_18 * y[jy].i);
              y[jy].i = fStack_18 * fVar8 + trans_local._4_4_ * fVar9;
              jy = incy + jy;
            }
          }
          else {
            for (irow = 0; irow < j; irow = irow + 1) {
              sVar5.i = comp_one.i;
              sVar5.r = comp_one.r;
              y[jy] = sVar5;
              jy = incy + jy;
            }
          }
        }
      }
      if ((beta_local.r == comp_one.r) && (!NAN(beta_local.r) && !NAN(comp_one.r))) {
        if ((beta_local.i == comp_one.i) && (!NAN(beta_local.i) && !NAN(comp_one.i))) {
          return 0;
        }
      }
      if (bVar7) {
        kx = notran;
        if (incy == 1) {
          for (iy = 0; iy < A->ncol; iy = iy + 1) {
            if ((((x[kx].r != comp_one.r) || (NAN(x[kx].r) || NAN(comp_one.r))) ||
                (x[kx].i != comp_one.i)) || (NAN(x[kx].i) || NAN(comp_one.i))) {
              fVar8 = beta_local.r * x[kx].r + -(beta_local.i * x[kx].i);
              fVar9 = beta_local.i * x[kx].r + beta_local.r * x[kx].i;
              for (irow = *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)iy * 4);
                  irow < *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)(iy + 1) * 4);
                  irow = irow + 1) {
                iVar6 = *(int *)(*(long *)((long)pvVar3 + 0x10) + (long)irow * 4);
                fVar1 = *(float *)(stack0xffffffffffffffa0 + (long)irow * 8);
                fVar2 = *(float *)(stack0xffffffffffffffa0 + 4 + (long)irow * 8);
                y[iVar6].r = y[iVar6].r +
                             fVar8 * *(float *)(stack0xffffffffffffffa0 + (long)irow * 8) +
                             -(fVar9 * *(float *)(stack0xffffffffffffffa0 + 4 + (long)irow * 8));
                y[iVar6].i = y[iVar6].i + fVar9 * fVar1 + fVar8 * fVar2;
              }
            }
            kx = incx + kx;
          }
        }
        else {
          sprintf((char *)&ci_4,"%s at line %d in file %s\n","Not implemented.",0x22b,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/csp_blas2.c"
                 );
          superlu_abort_and_exit((char *)&ci_4);
        }
      }
      else {
        iVar6 = strncmp(trans,"T",1);
        if ((iVar6 == 0) || (iVar6 = strncmp(trans,"t",1), iVar6 == 0)) {
          ky = (int)comp_zero.i;
          if (incx == 1) {
            for (iy = 0; iy < A->ncol; iy = iy + 1) {
              temp1.i = comp_one.i;
              temp1.r = comp_one.r;
              irow = *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)iy * 4);
              while( true ) {
                if (*(int *)(*(long *)((long)pvVar3 + 0x18) + (long)(iy + 1) * 4) <= irow) break;
                iVar6 = *(int *)(*(long *)((long)pvVar3 + 0x10) + (long)irow * 4);
                temp1.i = temp1.i + *(float *)(stack0xffffffffffffffa0 + 4 + (long)irow * 8) *
                                    x[iVar6].r +
                                    *(float *)(stack0xffffffffffffffa0 + (long)irow * 8) *
                                    x[iVar6].i;
                temp1.r = temp1.r + *(float *)(stack0xffffffffffffffa0 + (long)irow * 8) *
                                    x[iVar6].r +
                                    -(*(float *)(stack0xffffffffffffffa0 + 4 + (long)irow * 8) *
                                     x[iVar6].i);
                irow = irow + 1;
              }
              y[ky].r = y[ky].r + beta_local.r * temp1.r + -(beta_local.i * temp1.i);
              y[ky].i = y[ky].i + beta_local.i * temp1.r + beta_local.r * temp1.i;
              ky = incy + ky;
            }
          }
          else {
            sprintf((char *)&temp2,"%s at line %d in file %s\n","Not implemented.",0x23d,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/csp_blas2.c"
                   );
            superlu_abort_and_exit((char *)&temp2);
          }
        }
        else {
          ky = (int)comp_zero.i;
          if (incx == 1) {
            for (iy = 0; iy < A->ncol; iy = iy + 1) {
              temp1.i = comp_one.i;
              temp1.r = comp_one.r;
              irow = *(int *)(*(long *)((long)pvVar3 + 0x18) + (long)iy * 4);
              while( true ) {
                if (*(int *)(*(long *)((long)pvVar3 + 0x18) + (long)(iy + 1) * 4) <= irow) break;
                iVar6 = *(int *)(*(long *)((long)pvVar3 + 0x10) + (long)irow * 4);
                fVar8 = *(float *)(stack0xffffffffffffffa0 + (long)irow * 8);
                fVar9 = -*(float *)(stack0xffffffffffffffa0 + 4 + (long)irow * 8);
                temp1.i = temp1.i + fVar9 * x[iVar6].r + fVar8 * x[iVar6].i;
                temp1.r = temp1.r + fVar8 * x[iVar6].r + -(fVar9 * x[iVar6].i);
                irow = irow + 1;
              }
              y[ky].r = y[ky].r + beta_local.r * temp1.r + -(beta_local.i * temp1.i);
              y[ky].i = y[ky].i + beta_local.i * temp1.r + beta_local.r * temp1.i;
              ky = incy + ky;
            }
          }
          else {
            sprintf(local_408,"%s at line %d in file %s\n","Not implemented.",0x252,
                    "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/csp_blas2.c"
                   );
            superlu_abort_and_exit(local_408);
          }
        }
      }
    }
  }
  else {
    input_error("sp_cgemv ",(int *)&temp);
  }
  return 0;
}

Assistant:

int
sp_cgemv(char *trans, singlecomplex alpha, SuperMatrix *A, singlecomplex *x, 
	 int incx, singlecomplex beta, singlecomplex *y, int incy)
{

    /* Local variables */
    NCformat *Astore;
    singlecomplex   *Aval;
    int info;
    singlecomplex temp, temp1;
    int lenx, leny, i, j, irow;
    int iy, jx, jy, kx, ky;
    int notran;
    singlecomplex comp_zero = {0.0, 0.0};
    singlecomplex comp_one = {1.0, 0.0};

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0)
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_cgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if ( A->nrow == 0 || A->ncol == 0 || 
	 (c_eq(&alpha, &comp_zero) && c_eq(&beta, &comp_one)) )
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if ( notran ) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if ( !c_eq(&beta, &comp_one) ) {
	if (incy == 1) {
	    if ( c_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) y[i] = comp_zero;
	    else
		for (i = 0; i < leny; ++i) 
		  cc_mult(&y[i], &beta, &y[i]);
	} else {
	    iy = ky;
	    if ( c_eq(&beta, &comp_zero) )
		for (i = 0; i < leny; ++i) {
		    y[iy] = comp_zero;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    cc_mult(&y[iy], &beta, &y[iy]);
		    iy += incy;
		}
	}
    }
    
    if ( c_eq(&alpha, &comp_zero) ) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if ( !c_eq(&x[jx], &comp_zero) ) {
		    cc_mult(&temp, &alpha, &x[jx]);
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			cc_mult(&temp1, &temp,  &Aval[i]);
			c_add(&y[irow], &y[irow], &temp1);
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else if (strncmp(trans, "T", 1) == 0 || strncmp(trans, "t", 1) == 0) {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    cc_mult(&temp1, &Aval[i], &x[irow]);
		    c_add(&temp, &temp, &temp1);
		}
		cc_mult(&temp1, &alpha, &temp);
		c_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else { /* trans == 'C' or 'c' */
	/* Form  y := alpha * conj(A) * x + y. */
	singlecomplex temp2;
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = comp_zero;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp2.r = Aval[i].r;
		    temp2.i = -Aval[i].i;  /* conjugation */
		    cc_mult(&temp1, &temp2, &x[irow]);
		    c_add(&temp, &temp, &temp1);
		}
		cc_mult(&temp1, &alpha, &temp);
		c_add(&y[jy], &y[jy], &temp1);
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;    
}